

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrPassthroughLayerPurposeFB value)

{
  pointer pbVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *enabled_extension_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *enabled_extension;
  pointer pbVar3;
  string vuid;
  string error_str;
  string local_d0;
  string local_b0;
  string *local_90;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_88;
  string *local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  local_90 = command_name;
  local_88 = objects_info;
  local_80 = item_name;
  if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
LAB_00144a61:
    if (value < 2) {
      return true;
    }
    if (value == XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_MASKED_HANDS_FB) {
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      pbVar1 = (instance_info->enabled_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar3 = (instance_info->enabled_extensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1
          ) {
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
        if (iVar2 == 0) {
          return true;
        }
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"VUID-","");
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(validation_name->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d0);
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(local_80->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "XrPassthroughLayerPurposeFB value \"XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_MASKED_HANDS_FB\""
                 ,"");
      std::__cxx11::string::append((char *)&local_b0);
      std::__cxx11::string::append((char *)&local_b0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_78,local_88);
      CoreValidLogMessage(instance_info,&local_d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_90,
                          &local_78,&local_b0);
      local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_78.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_78.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      if (value != XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_HANDS_FB) {
        return false;
      }
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      pbVar1 = (instance_info->enabled_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar3 = (instance_info->enabled_extensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1
          ) {
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
        if (iVar2 == 0) {
          return true;
        }
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"VUID-","");
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(validation_name->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d0);
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(local_80->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "XrPassthroughLayerPurposeFB value \"XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_HANDS_FB\""
                 ,"");
      std::__cxx11::string::append((char *)&local_b0);
      std::__cxx11::string::append((char *)&local_b0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_60,local_88);
      CoreValidLogMessage(instance_info,&local_d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_90,
                          &local_60,&local_b0);
    }
  }
  else {
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (instance_info->enabled_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      if (iVar2 == 0) goto LAB_00144a61;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(validation_name->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(local_80->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_d0);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"XrPassthroughLayerPurposeFB requires extension ","");
    std::__cxx11::string::append((char *)&local_b0);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_48,local_88);
    CoreValidLogMessage(instance_info,&local_d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_90,&local_48,
                        &local_b0);
    local_60.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_60.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  if (local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrPassthroughLayerPurposeFB value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_FB_passthrough, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_passthrough")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrPassthroughLayerPurposeFB requires extension ";
        error_str += " \"XR_FB_passthrough\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_PASSTHROUGH_LAYER_PURPOSE_RECONSTRUCTION_FB:
            return true;
        case XR_PASSTHROUGH_LAYER_PURPOSE_PROJECTED_FB:
            return true;
        case XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_HANDS_FB:
            // Enum value XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_HANDS_FB requires extension XR_FB_passthrough_keyboard_hands, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_passthrough_keyboard_hands")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrPassthroughLayerPurposeFB value \"XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_HANDS_FB\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_FB_passthrough_keyboard_hands\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_MASKED_HANDS_FB:
            // Enum value XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_MASKED_HANDS_FB requires extension XR_FB_passthrough_keyboard_hands, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_passthrough_keyboard_hands")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrPassthroughLayerPurposeFB value \"XR_PASSTHROUGH_LAYER_PURPOSE_TRACKED_KEYBOARD_MASKED_HANDS_FB\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_FB_passthrough_keyboard_hands\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}